

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

InstanceSymbol *
slang::ast::InstanceSymbol::createDefault
          (Compilation *comp,DefinitionSymbol *definition,
          HierarchyOverrideNode *hierarchyOverrideNode,ConfigBlockSymbol *configBlock,
          ConfigRule *configRule,SourceLocation locationOverride)

{
  size_t sVar1;
  InstanceBodySymbol *args_2;
  InstanceSymbol *args_1;
  ResolvedConfig *pRVar2;
  SourceLocation loc;
  SourceLocation local_30;
  
  if (((ulong)locationOverride & 0xfffffff) == 0) {
    locationOverride = (definition->super_Symbol).location;
  }
  local_30 = locationOverride;
  args_2 = InstanceBodySymbol::fromDefinition
                     (comp,definition,locationOverride,(bitmask<slang::ast::InstanceFlags>)0x0,
                      hierarchyOverrideNode,configBlock,configRule);
  args_1 = BumpAllocator::
           emplace<slang::ast::InstanceSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation&,slang::ast::InstanceBodySymbol&>
                     (&comp->super_BumpAllocator,&(definition->super_Symbol).name,&local_30,args_2);
  if (configBlock != (ConfigBlockSymbol *)0x0) {
    pRVar2 = BumpAllocator::
             emplace<slang::ast::ResolvedConfig,slang::ast::ConfigBlockSymbol_const&,slang::ast::InstanceSymbol&>
                       (&comp->super_BumpAllocator,configBlock,args_1);
    pRVar2->configRule = configRule;
    if ((configRule != (ConfigRule *)0x0) &&
       (configRule->isUsed = true,
       (configRule->liblist).
       super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
       ._M_payload.
       super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
       ._M_engaged == true)) {
      sVar1 = (configRule->liblist).
              super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
              ._M_payload._M_value._M_extent._M_extent_value;
      (pRVar2->liblist)._M_ptr =
           (configRule->liblist).
           super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
           ._M_payload._M_value._M_ptr;
      (pRVar2->liblist)._M_extent._M_extent_value = sVar1;
    }
    args_1->resolvedConfig = pRVar2;
  }
  return args_1;
}

Assistant:

InstanceSymbol& InstanceSymbol::createDefault(Compilation& comp, const DefinitionSymbol& definition,
                                              const HierarchyOverrideNode* hierarchyOverrideNode,
                                              const ConfigBlockSymbol* configBlock,
                                              const ConfigRule* configRule,
                                              SourceLocation locationOverride) {
    auto loc = locationOverride ? locationOverride : definition.location;
    auto& result = *comp.emplace<InstanceSymbol>(
        definition.name, loc,
        InstanceBodySymbol::fromDefinition(comp, definition, loc, InstanceFlags::None,
                                           hierarchyOverrideNode, configBlock, configRule));

    if (configBlock) {
        auto rc = comp.emplace<ResolvedConfig>(*configBlock, result);
        rc->configRule = configRule;

        if (configRule) {
            configRule->isUsed = true;
            if (configRule->liblist)
                rc->liblist = *configRule->liblist;
        }
        result.resolvedConfig = rc;
    }

    return result;
}